

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utils.cpp
# Opt level: O1

size_t countTags(TestStream *input,uint64_t tagToCount)

{
  uint64_t uVar1;
  int iVar2;
  undefined4 extraout_var;
  uint64_t *extraout_RDX;
  size_t sVar3;
  Range payload;
  Range local_48;
  size_t local_38;
  
  local_38 = input->readPos;
  sVar3 = 0;
  while( true ) {
    iVar2 = (*(input->super_EntryStream)._vptr_EntryStream[2])(input);
    local_48._begin = (char *)CONCAT44(extraout_var,iVar2);
    if ((uint64_t *)local_48._begin == extraout_RDX) break;
    binlog::Range::throw_if_overflow(&local_48,8);
    uVar1 = *(uint64_t *)local_48._begin;
    local_48._begin = (char *)((long)local_48._begin + 8);
    sVar3 = sVar3 + (uVar1 == tagToCount);
  }
  input->readPos = local_38;
  return sVar3;
}

Assistant:

std::size_t countTags(TestStream& input, std::uint64_t tagToCount)
{
  std::size_t result = 0;
  const std::size_t oldReadPos = input.readPos;

  while (binlog::Range payload = input.nextEntryPayload())
  {
    const std::uint64_t tag = payload.read<std::uint64_t>();
    if (tag == tagToCount) { ++result; }
  }

  input.readPos = oldReadPos;

  return result;
}